

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::osout<char,char[12],int,char[14],char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ptc *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*args) [12],int *args_1,
          char (*args_2) [14],char *args_3)

{
  string *psVar1;
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  ostream *poVar2;
  Print<char> printer;
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [104];
  undefined1 local_210 [104];
  ostream local_1a8;
  
  Print<char>::Print((Print<char> *)local_278);
  sbuf_00 = *(basic_streambuf<char,_std::char_traits<char>_> **)
             (this + *(long *)(*(long *)this + -0x18) + 0xe8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  savebuf<char>::savebuf((savebuf<char> *)local_210,sbuf_00);
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  poVar2 = std::operator<<(&local_1a8,(char *)os);
  psVar1 = (string *)(local_278 + 0x20);
  std::operator<<(poVar2,psVar1);
  poVar2 = (ostream *)std::ostream::operator<<(&local_1a8,*(int *)*args);
  std::operator<<(poVar2,psVar1);
  poVar2 = std::operator<<(&local_1a8,(char *)args_1);
  std::operator<<(poVar2,psVar1);
  poVar2 = std::operator<<(&local_1a8,(*args_2)[0]);
  std::operator<<(poVar2,psVar1);
  std::__cxx11::stringbuf::str();
  Print<char>::print_backend<std::ostream&,std::__cxx11::string>
            ((Print<char> *)local_278,(basic_ostream<char,_std::char_traits<char>_> *)this,
             &local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_210 + 0x48));
  savebuf<char>::~savebuf((savebuf<char> *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  Print<char>::~Print((Print<char> *)local_278);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }